

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsort_impl.h
# Opt level: O3

void heap_down(uchar *a,size_t i,size_t heap_size,size_t stride,
              _func_int_void_ptr_void_ptr_void_ptr *cmp,void *cmp_data)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  uint64_t uVar173;
  uint64_t uVar174;
  int iVar175;
  uint uVar176;
  uint uVar177;
  ulong uVar178;
  secp256k1_context *z;
  void *pvVar179;
  uint uVar180;
  secp256k1_context *extraout_RDX;
  secp256k1_scalar *extraout_RDX_00;
  secp256k1_scalar *extraout_RDX_01;
  secp256k1_scalar *a_00;
  secp256k1_scalar *a_01;
  secp256k1_scalar *extraout_RDX_02;
  secp256k1_scalar *extraout_RDX_03;
  secp256k1_scalar *psVar181;
  secp256k1_scalar *extraout_RDX_04;
  secp256k1_scalar *a_02;
  ulong extraout_RDX_05;
  secp256k1_ge *a_03;
  ulong uVar182;
  uint64_t uVar183;
  secp256k1_context *psVar184;
  secp256k1_context *psVar185;
  long lVar186;
  secp256k1_context *psVar187;
  secp256k1_context *r;
  ulong uVar188;
  ulong uVar189;
  ulong uVar190;
  uint uVar191;
  uchar *unaff_RBP;
  undefined8 *puVar192;
  secp256k1_context *a_04;
  ulong uVar193;
  secp256k1_context *psVar194;
  secp256k1_fe *psVar195;
  undefined8 *puVar196;
  uint64_t *puVar197;
  secp256k1_context *r_00;
  ulong uVar198;
  uint uVar199;
  secp256k1_gej *psVar200;
  ulong uVar201;
  ulong uVar202;
  ulong unaff_R12;
  long lVar203;
  int *piVar204;
  _func_void_char_ptr_void_ptr *p_Var205;
  secp256k1_context *psVar206;
  _func_void_char_ptr_void_ptr *p_Var207;
  undefined8 *unaff_R14;
  ulong uVar208;
  byte bVar209;
  undefined1 auStack_7f8 [56];
  uint64_t uStack_7c0;
  uint64_t uStack_7b8;
  uint64_t uStack_7b0;
  uint64_t uStack_7a8;
  int iStack_7a0;
  undefined1 auStack_798 [56];
  uint64_t uStack_760;
  _func_void_char_ptr_void_ptr *p_Stack_758;
  void *pvStack_750;
  _func_void_char_ptr_void_ptr *p_Stack_748;
  int iStack_740;
  undefined4 uStack_73c;
  ulong uStack_738;
  ulong uStack_730;
  undefined1 auStack_728 [48];
  secp256k1_fe sStack_6f8;
  secp256k1_fe sStack_6c8;
  undefined1 auStack_698 [48];
  secp256k1_fe sStack_668;
  undefined1 auStack_638 [56];
  ulong uStack_600;
  ulong uStack_5f8;
  ulong uStack_5f0;
  uint64_t uStack_5e8;
  uint64_t uStack_5e0;
  secp256k1_context *psStack_5d0;
  secp256k1_gej *psStack_5c8;
  secp256k1_context *psStack_5c0;
  secp256k1_context *psStack_5b8;
  secp256k1_context *psStack_5b0;
  secp256k1_context *psStack_5a8;
  secp256k1_context *psStack_598;
  secp256k1_context *psStack_590;
  secp256k1_context *psStack_588;
  secp256k1_context *psStack_580;
  secp256k1_context *psStack_578;
  char cStack_569;
  secp256k1_context *psStack_568;
  secp256k1_context *psStack_560;
  secp256k1_context *psStack_558;
  undefined4 *puStack_550;
  secp256k1_context *psStack_548;
  long lStack_540;
  secp256k1_context *psStack_538;
  undefined1 auStack_530 [56];
  uint64_t uStack_4f8;
  uint64_t uStack_4f0;
  uint64_t uStack_4e8;
  uint64_t uStack_4e0;
  uint64_t uStack_4d8;
  undefined4 uStack_4c8;
  undefined4 uStack_4c4;
  undefined1 auStack_4c0 [24];
  undefined1 auStack_4a8 [16];
  uint64_t uStack_498;
  secp256k1_scalar asStack_490 [132];
  secp256k1_context asStack_280 [2];
  size_t sStack_78;
  ulong uStack_70;
  ulong uStack_68;
  undefined8 *puStack_60;
  uchar *puStack_58;
  code *pcStack_50;
  ulong local_48;
  undefined8 *local_40;
  ulong local_38;
  
  bVar209 = 0;
  local_38 = heap_size >> 1;
  psVar187 = (secp256k1_context *)i;
  psVar194 = (secp256k1_context *)a;
  local_48 = heap_size;
  local_40 = (undefined8 *)stride;
  if (i < local_38) {
    do {
      puVar192 = local_40;
      uVar189 = i * 2 + 1;
      if (local_48 <= uVar189) {
        pcStack_50 = secp256k1_ecmult_strauss_wnaf;
        heap_down_cold_1();
        auStack_4c0._0_8_ = 1;
        auStack_4c0._8_16_ = (undefined1  [16])0x0;
        auStack_4a8 = (undefined1  [16])0x0;
        uStack_498 = 0x100000001;
        psStack_578 = (secp256k1_context *)0x12053a;
        z = (secp256k1_context *)stride;
        psVar200 = (secp256k1_gej *)cmp;
        puStack_550 = (undefined4 *)cmp_data;
        psStack_548 = psVar187;
        sStack_78 = i;
        uStack_70 = unaff_R12;
        uStack_68 = uVar189;
        puStack_60 = unaff_R14;
        puStack_58 = a;
        pcStack_50 = (code *)unaff_RBP;
        secp256k1_fe_verify((secp256k1_fe *)auStack_4c0);
        cStack_569 = '\x01';
        psVar181 = extraout_RDX_00;
        if (extraout_RDX != (secp256k1_context *)0x0) {
          psVar184 = (secp256k1_context *)0x0;
          psStack_568 = (secp256k1_context *)0x0;
          psVar187 = extraout_RDX;
          goto LAB_0012055b;
        }
        psStack_568 = (secp256k1_context *)0x0;
        goto LAB_00120738;
      }
      unaff_R12 = i * 2 + 2;
      if (unaff_R12 < local_48) {
        pcStack_50 = (code *)0x120454;
        iVar175 = secp256k1_pubkey_cmp
                            ((secp256k1_context *)*local_40,
                             *(secp256k1_pubkey **)(a + unaff_R12 * 8),
                             *(secp256k1_pubkey **)(a + uVar189 * 8));
        if (iVar175 < 0) goto LAB_00120491;
        unaff_RBP = a + unaff_R12 * 8;
        psVar194 = (secp256k1_context *)*puVar192;
        pcStack_50 = (code *)0x12046c;
        iVar175 = secp256k1_pubkey_cmp
                            (psVar194,*(secp256k1_pubkey **)unaff_RBP,
                             *(secp256k1_pubkey **)(a + i * 8));
        if (iVar175 < 1) {
          return;
        }
      }
      else {
LAB_00120491:
        psVar194 = (secp256k1_context *)*puVar192;
        pcStack_50 = (code *)0x1204a1;
        iVar175 = secp256k1_pubkey_cmp
                            (psVar194,*(secp256k1_pubkey **)(a + uVar189 * 8),
                             *(secp256k1_pubkey **)(a + i * 8));
        if (iVar175 < 1) {
          return;
        }
        unaff_RBP = a + uVar189 * 8;
        unaff_R12 = uVar189;
      }
      stride = *(size_t *)(a + i * 8);
      psVar187 = *(secp256k1_context **)unaff_RBP;
      *(secp256k1_context **)(a + i * 8) = psVar187;
      *(size_t *)unaff_RBP = stride;
      i = unaff_R12;
      unaff_R14 = puVar192;
    } while (unaff_R12 < local_38);
  }
  return;
LAB_0012055b:
  psVar206 = asStack_280;
  if ((int)(((secp256k1_gej *)cmp)->x).n[0] != 0) {
    psStack_578 = (secp256k1_context *)0x12056e;
    secp256k1_gej_verify((secp256k1_gej *)stride);
    iVar175 = (int)z;
    psVar181 = extraout_RDX_01;
    if ((((secp256k1_context *)stride)->ecmult_gen_ctx).initial.z.magnitude == 0) {
      psStack_578 = (secp256k1_context *)0x120591;
      secp256k1_scalar_split_lambda
                (asStack_490,(secp256k1_scalar *)auStack_530,(secp256k1_scalar *)cmp);
      psVar185 = (secp256k1_context *)((long)psVar184 * 0x410);
      psStack_578 = (secp256k1_context *)0x1205b1;
      psStack_558 = psVar184;
      iVar175 = secp256k1_ecmult_wnaf
                          ((int *)((long)(psVar185->ecmult_gen_ctx).initial.x.n +
                                  ((psVar194->ecmult_gen_ctx).initial.x.n[1] - 8)),(int)asStack_490,
                           a_00,iVar175);
      uVar183 = (psVar194->ecmult_gen_ctx).initial.x.n[1];
      r = (secp256k1_context *)((long)psVar185[2].ecmult_gen_ctx.initial.z.n + uVar183 + 0xc);
      *(int *)((long)psVar185[5].ecmult_gen_ctx.initial.x.n + uVar183 + 0x18) = iVar175;
      psVar184 = (secp256k1_context *)auStack_530;
      psStack_578 = (secp256k1_context *)0x1205d0;
      uVar176 = secp256k1_ecmult_wnaf((int *)r,(int)psVar184,a_01,(int)uVar183);
      uVar183 = (psVar194->ecmult_gen_ctx).initial.x.n[1];
      *(uint *)((long)psVar185[5].ecmult_gen_ctx.initial.x.n + uVar183 + 0x1c) = uVar176;
      uVar180 = *(uint *)((long)psVar185[5].ecmult_gen_ctx.initial.x.n + uVar183 + 0x18);
      z = (secp256k1_context *)(ulong)uVar180;
      if (0x81 < (int)uVar180) goto LAB_00120ba0;
      if (0x81 < (int)uVar176) goto LAB_00120ba5;
      if ((int)uVar180 <= (int)psStack_568) {
        z = (secp256k1_context *)((ulong)psStack_568 & 0xffffffff);
      }
      if ((int)z < (int)uVar176) {
        z = (secp256k1_context *)(ulong)uVar176;
      }
      psStack_578 = (secp256k1_context *)0x12061e;
      psStack_568 = z;
      memcpy(psVar206,(void *)stride,0x98);
      psVar184 = psStack_558;
      if (psStack_558 != (secp256k1_context *)0x0) {
        psStack_578 = (secp256k1_context *)0x12063e;
        secp256k1_gej_rescale((secp256k1_gej *)psVar206,(secp256k1_fe *)auStack_4c0);
      }
      z = asStack_280;
      psStack_578 = (secp256k1_context *)0x12066a;
      secp256k1_ecmult_odd_multiples_table
                ((int)psVar184 * 0x1a0 + (int)(psVar194->ecmult_gen_ctx).initial.x.n[0],
                 (secp256k1_ge *)((long)psVar184 * 0xc0 + *(uint64_t *)&psVar194->ecmult_gen_ctx),
                 (secp256k1_fe *)auStack_4c0,(secp256k1_fe *)z,psVar200);
      psVar181 = extraout_RDX_02;
      if (psVar184 != (secp256k1_context *)0x0) {
        psVar195 = (secp256k1_fe *)((long)psVar184 * 0xc0 + *(uint64_t *)&psVar194->ecmult_gen_ctx);
        psStack_578 = (secp256k1_context *)0x12068e;
        secp256k1_fe_mul(psVar195,psVar195,
                         (secp256k1_fe *)
                         &(((secp256k1_context *)stride)->ecmult_gen_ctx).initial.y.magnitude);
        psVar181 = extraout_RDX_03;
      }
      psVar184 = (secp256k1_context *)((long)&(psVar184->ecmult_gen_ctx).built + 1);
    }
  }
  stride = (size_t)&(((secp256k1_context *)stride)->ecmult_gen_ctx).initial.infinity;
  cmp = (_func_int_void_ptr_void_ptr_void_ptr *)((long)(((secp256k1_gej *)cmp)->x).n + 4);
  psVar187 = (secp256k1_context *)&psVar187[-1].field_0xc7;
  if (psVar187 == (secp256k1_context *)0x0) {
    if (psVar184 == (secp256k1_context *)0x0) {
LAB_00120738:
      psStack_558 = (secp256k1_context *)0x0;
    }
    else {
      psStack_578 = (secp256k1_context *)0x1206c9;
      cStack_569 = psVar184 == (secp256k1_context *)0x0;
      secp256k1_ge_table_set_globalz
                ((long)psVar184 * 4,(secp256k1_ge *)(psVar194->ecmult_gen_ctx).initial.x.n[0],
                 *(secp256k1_fe **)&psVar194->ecmult_gen_ctx);
      lVar203 = 0;
      psVar206 = (secp256k1_context *)0x0;
      psVar187 = (secp256k1_context *)0x0;
      psStack_558 = psVar184;
      do {
        lVar186 = 0;
        psStack_560 = psVar206;
        do {
          psStack_578 = (secp256k1_context *)0x1206fc;
          secp256k1_fe_mul((secp256k1_fe *)
                           (*(uint64_t *)&psVar194->ecmult_gen_ctx + lVar203 + lVar186),
                           (secp256k1_fe *)
                           ((long)(psVar206->ecmult_gen_ctx).initial.x.n +
                           ((psVar194->ecmult_gen_ctx).initial.x.n[0] - 8)),&secp256k1_const_beta);
          psVar206 = (secp256k1_context *)&(psVar206->ecmult_gen_ctx).initial.z;
          lVar186 = lVar186 + 0x30;
        } while (lVar186 != 0xc0);
        psVar187 = (secp256k1_context *)((long)&(psVar187->ecmult_gen_ctx).built + 1);
        psVar206 = (secp256k1_context *)(psStack_560[2].ecmult_gen_ctx.initial.x.n + 1);
        lVar203 = lVar203 + 0xc0;
        psVar181 = extraout_RDX_04;
      } while (psVar187 != psStack_558);
    }
    r = psStack_548;
    if (puStack_550 == (undefined4 *)0x0) {
      puStack_550 = (undefined4 *)0x0;
      lStack_540 = 0;
      uVar180 = (uint)psStack_568;
    }
    else {
      uStack_4c4 = *puStack_550;
      uStack_4c8 = 0;
      psStack_578 = (secp256k1_context *)0x120776;
      uVar176 = secp256k1_ecmult_wnaf((int *)asStack_280,(int)&uStack_4c4,psVar181,(int)z);
      psStack_578 = (secp256k1_context *)0x120788;
      uVar177 = secp256k1_ecmult_wnaf((int *)asStack_490,(int)&uStack_4c8,a_02,(int)z);
      uVar180 = (uint)psStack_568;
      if ((int)(uint)psStack_568 < (int)uVar176) {
        uVar180 = uVar176;
      }
      if ((int)uVar180 < (int)uVar177) {
        uVar180 = uVar177;
      }
      lStack_540 = (long)(int)uVar177;
      puStack_550 = (undefined4 *)(long)(int)uVar176;
    }
    psStack_578 = (secp256k1_context *)0x1207c7;
    secp256k1_gej_set_infinity((secp256k1_gej *)r);
    if (0 < (int)uVar180) {
      psVar187 = (secp256k1_context *)(ulong)uVar180;
      psStack_568 = (secp256k1_context *)((long)psVar187 * 4 + -4);
      psStack_538 = psVar194;
      do {
        psStack_578 = (secp256k1_context *)0x1207f0;
        secp256k1_gej_double_var((secp256k1_gej *)r,(secp256k1_gej *)r,(secp256k1_fe *)0x0);
        psVar184 = psVar187;
        psStack_560 = psVar187;
        if (cStack_569 == '\0') {
          cmp = (_func_int_void_ptr_void_ptr_void_ptr *)0x40c;
          stride = 0x30;
          psVar185 = (secp256k1_context *)0x0;
          psVar187 = psStack_568;
          psVar206 = psStack_558;
          do {
            z = (secp256k1_context *)(psVar194->ecmult_gen_ctx).initial.x.n[1];
            if (((long)psVar184 <= (long)*(int *)(&z[-1].field_0xc4 + (long)cmp)) &&
               (uVar180 = *(uint *)((long)&psVar187[-1].declassify +
                                   (long)&(z->ecmult_gen_ctx).initial.x), uVar180 != 0)) {
              if ((uVar180 & 1) == 0) {
                psStack_578 = (secp256k1_context *)0x120b7d;
                secp256k1_ecmult_strauss_wnaf_cold_6();
LAB_00120b7d:
                psStack_578 = (secp256k1_context *)0x120b82;
                secp256k1_ecmult_strauss_wnaf_cold_5();
LAB_00120b82:
                psStack_578 = (secp256k1_context *)0x120b87;
                secp256k1_ecmult_strauss_wnaf_cold_10();
LAB_00120b87:
                psStack_578 = (secp256k1_context *)0x120b8c;
                secp256k1_ecmult_strauss_wnaf_cold_4();
LAB_00120b8c:
                psStack_578 = (secp256k1_context *)0x120b91;
                secp256k1_ecmult_strauss_wnaf_cold_9();
LAB_00120b91:
                psStack_578 = (secp256k1_context *)0x120b96;
                secp256k1_ecmult_strauss_wnaf_cold_8();
              }
              else {
                if ((int)uVar180 < -7) goto LAB_00120b7d;
                if (7 < (int)uVar180) goto LAB_00120b87;
                uVar183 = (psVar194->ecmult_gen_ctx).initial.x.n[0];
                if (0 < (int)uVar180) {
                  puVar192 = (undefined8 *)
                             ((long)&(((secp256k1_context *)stride)->ecmult_gen_ctx).initial.x +
                             uVar183 + (ulong)(uVar180 - 1 >> 1) * 0x68 + -0x38);
                  puVar196 = (undefined8 *)auStack_530;
                  for (lVar203 = 0xd; lVar203 != 0; lVar203 = lVar203 + -1) {
                    *puVar196 = *puVar192;
                    puVar192 = puVar192 + (ulong)bVar209 * -2 + 1;
                    puVar196 = puVar196 + (ulong)bVar209 * -2 + 1;
                  }
LAB_0012092b:
                  psStack_578 = (secp256k1_context *)0x12093d;
                  r = psStack_548;
                  secp256k1_gej_add_ge_var
                            ((secp256k1_gej *)psStack_548,(secp256k1_gej *)psStack_548,
                             (secp256k1_ge *)auStack_530,(secp256k1_fe *)0x0);
                  z = (secp256k1_context *)(psVar194->ecmult_gen_ctx).initial.x.n[1];
                  psVar184 = psStack_560;
                  goto LAB_00120946;
                }
                psVar184 = (secp256k1_context *)
                           ((long)&(((secp256k1_context *)stride)->ecmult_gen_ctx).initial.x +
                           uVar183 + (ulong)(~uVar180 >> 1) * 0x68 + -0x38);
                puVar197 = (uint64_t *)auStack_530;
                for (z = (secp256k1_context *)0xd; z != (secp256k1_context *)0x0;
                    z = (secp256k1_context *)&z[-1].field_0xc7) {
                  *puVar197 = *(uint64_t *)&psVar184->ecmult_gen_ctx;
                  psVar184 = (secp256k1_context *)((long)psVar184 + (ulong)bVar209 * -0x10 + 8);
                  puVar197 = puVar197 + (ulong)bVar209 * -2 + 1;
                }
                psVar194 = (secp256k1_context *)(auStack_530 + 0x30);
                psStack_578 = (secp256k1_context *)0x1208af;
                r = psVar194;
                secp256k1_fe_verify((secp256k1_fe *)psVar194);
                if ((int)uStack_4d8 < 2) {
                  auStack_530._48_8_ = 0x3ffffbfffff0bc - auStack_530._48_8_;
                  uStack_4f8 = 0x3ffffffffffffc - uStack_4f8;
                  uStack_4f0 = 0x3ffffffffffffc - uStack_4f0;
                  uStack_4e8 = 0x3ffffffffffffc - uStack_4e8;
                  uStack_4e0 = 0x3fffffffffffc - uStack_4e0;
                  uStack_4d8 = 2;
                  psStack_578 = (secp256k1_context *)0x120921;
                  secp256k1_fe_verify((secp256k1_fe *)psVar194);
                  psVar194 = psStack_538;
                  goto LAB_0012092b;
                }
              }
              psStack_578 = (secp256k1_context *)0x120b9b;
              secp256k1_ecmult_strauss_wnaf_cold_3();
LAB_00120b9b:
              psStack_578 = (secp256k1_context *)0x120ba0;
              secp256k1_ecmult_strauss_wnaf_cold_7();
              goto LAB_00120ba0;
            }
LAB_00120946:
            if (((long)psVar184 <=
                 (long)*(int *)((long)((((secp256k1_gej *)cmp)->x).n + -1) +
                               (long)&(z->ecmult_gen_ctx).initial.x)) &&
               (uVar180 = *(uint *)((undefined1 *)((long)z[2].ecmult_gen_ctx.initial.z.n + 0xc) +
                                   (long)psVar187), uVar180 != 0)) {
              if ((uVar180 & 1) == 0) goto LAB_00120b82;
              if ((int)uVar180 < -7) goto LAB_00120b8c;
              if (7 < (int)uVar180) goto LAB_00120b91;
              uVar183 = (psVar194->ecmult_gen_ctx).initial.x.n[0];
              if (0 < (int)uVar180) {
                uVar189 = (ulong)(uVar180 - 1 >> 1);
                psStack_578 = (secp256k1_context *)0x1209b0;
                secp256k1_ge_set_xy((secp256k1_ge *)auStack_530,
                                    (secp256k1_fe *)
                                    ((long)(&(psVar185->ecmult_gen_ctx).initial.x)[uVar189].n +
                                    (*(uint64_t *)&psVar194->ecmult_gen_ctx - 8)),
                                    (secp256k1_fe *)
                                    ((long)&(((secp256k1_context *)stride)->ecmult_gen_ctx).initial.
                                            x + uVar189 * 0x68 + uVar183 + -8));
LAB_00120a5f:
                z = (secp256k1_context *)0x0;
                psStack_578 = (secp256k1_context *)0x120a71;
                r = psStack_548;
                secp256k1_gej_add_ge_var
                          ((secp256k1_gej *)psStack_548,(secp256k1_gej *)psStack_548,
                           (secp256k1_ge *)auStack_530,(secp256k1_fe *)0x0);
                psVar184 = psStack_560;
                psVar194 = psStack_538;
                goto LAB_00120a7b;
              }
              z = (secp256k1_context *)((ulong)(~uVar180 >> 1) * 0x30);
              psVar184 = (secp256k1_context *)
                         ((undefined1 *)
                          ((long)(psVar185->ecmult_gen_ctx).initial.x.n +
                          (*(uint64_t *)&psVar194->ecmult_gen_ctx - 0x10)) +
                         (long)&(z->ecmult_gen_ctx).initial.x);
              psStack_578 = (secp256k1_context *)0x1209db;
              secp256k1_ge_set_xy((secp256k1_ge *)auStack_530,(secp256k1_fe *)psVar184,
                                  (secp256k1_fe *)
                                  ((long)&(((secp256k1_context *)stride)->ecmult_gen_ctx).initial.x
                                  + (ulong)(~uVar180 >> 1) * 0x68 + uVar183 + -8));
              psVar194 = (secp256k1_context *)(auStack_530 + 0x30);
              psStack_578 = (secp256k1_context *)0x1209e8;
              r = psVar194;
              secp256k1_fe_verify((secp256k1_fe *)psVar194);
              if ((int)uStack_4d8 < 2) {
                auStack_530._48_8_ = 0x3ffffbfffff0bc - auStack_530._48_8_;
                uStack_4f8 = 0x3ffffffffffffc - uStack_4f8;
                uStack_4f0 = 0x3ffffffffffffc - uStack_4f0;
                uStack_4e8 = 0x3ffffffffffffc - uStack_4e8;
                uStack_4e0 = 0x3fffffffffffc - uStack_4e0;
                uStack_4d8 = 2;
                psStack_578 = (secp256k1_context *)0x120a5a;
                secp256k1_fe_verify((secp256k1_fe *)psVar194);
                goto LAB_00120a5f;
              }
              goto LAB_00120b9b;
            }
LAB_00120a7b:
            psVar187 = (secp256k1_context *)(psVar187[5].ecmult_gen_ctx.initial.x.n + 4);
            cmp = (_func_int_void_ptr_void_ptr_void_ptr *)
                  ((((secp256k1_gej *)((long)cmp + 0x390))->z).n + 4);
            stride = (size_t)((((secp256k1_context *)(stride + 400))->ecmult_gen_ctx).initial.x.n +
                             1);
            psVar185 = (secp256k1_context *)&psVar185->declassify;
            psVar206 = (secp256k1_context *)&psVar206[-1].field_0xc7;
          } while (psVar206 != (secp256k1_context *)0x0);
        }
        r = psStack_548;
        psVar187 = (secp256k1_context *)&psVar184[-1].field_0xc7;
        if (((long)psVar184 <= (long)puStack_550) &&
           (iVar175 = *(int *)((long)asStack_280[0].ecmult_gen_ctx.initial.x.n +
                              (long)psVar187 * 4 + -8), iVar175 != 0)) {
          psStack_578 = (secp256k1_context *)0x120acf;
          secp256k1_ecmult_table_get_ge_storage
                    ((secp256k1_ge *)auStack_530,secp256k1_pre_g,iVar175,(int)z);
          z = (secp256k1_context *)auStack_4c0;
          psStack_578 = (secp256k1_context *)0x120ae8;
          secp256k1_gej_add_zinv_var
                    ((secp256k1_gej *)r,(secp256k1_gej *)r,(secp256k1_ge *)auStack_530,
                     (secp256k1_fe *)z);
          psVar184 = psStack_560;
        }
        if (((long)psVar184 <= lStack_540) && (asStack_490[(long)psVar187] != 0)) {
          psStack_578 = (secp256k1_context *)0x120b16;
          secp256k1_ecmult_table_get_ge_storage
                    ((secp256k1_ge *)auStack_530,secp256k1_pre_g_128,asStack_490[(long)psVar187],
                     (int)z);
          z = (secp256k1_context *)auStack_4c0;
          psStack_578 = (secp256k1_context *)0x120b2f;
          secp256k1_gej_add_zinv_var
                    ((secp256k1_gej *)r,(secp256k1_gej *)r,(secp256k1_ge *)auStack_530,
                     (secp256k1_fe *)z);
          psVar184 = psStack_560;
        }
        psStack_568 = (secp256k1_context *)&psStack_568[-1].field_0xc4;
      } while (1 < (long)psVar184);
    }
    if ((r->ecmult_gen_ctx).initial.z.magnitude == 0) {
      piVar204 = &(r->ecmult_gen_ctx).initial.y.magnitude;
      psStack_578 = (secp256k1_context *)0x120b66;
      secp256k1_fe_mul((secp256k1_fe *)piVar204,(secp256k1_fe *)piVar204,(secp256k1_fe *)auStack_4c0
                      );
    }
    return;
  }
  goto LAB_0012055b;
LAB_00120ba0:
  psStack_578 = (secp256k1_context *)0x120ba5;
  secp256k1_ecmult_strauss_wnaf_cold_2();
LAB_00120ba5:
  psStack_578 = (secp256k1_context *)secp256k1_ecmult_wnaf;
  secp256k1_ecmult_strauss_wnaf_cold_1();
  a_04 = psVar184;
  r_00 = r;
  psStack_588 = psVar185;
  psStack_580 = psVar194;
  psStack_578 = psVar187;
  if (r == (secp256k1_context *)0x0) {
LAB_00120c72:
    psVar184 = psVar194;
    psStack_590 = (secp256k1_context *)0x120c77;
    secp256k1_ecmult_wnaf_cold_4();
LAB_00120c77:
    r = psVar185;
    psStack_590 = (secp256k1_context *)0x120c7c;
    secp256k1_ecmult_wnaf_cold_3();
  }
  else {
    if (psVar184 == (secp256k1_context *)0x0) goto LAB_00120c77;
    psVar187 = (secp256k1_context *)0x0;
    psStack_590 = (secp256k1_context *)0x120bd4;
    memset(r,0,0x204);
    uVar180 = (uint)*(uint64_t *)&(psVar184->ecmult_gen_ctx).built;
    a_04 = (secp256k1_context *)0x4;
    z = (secp256k1_context *)0x0;
    do {
      uVar176 = (uint)z;
      uVar177 = (uint)psVar187;
      if (uVar176 < 0x20) {
        uVar199 = uVar180 >> ((byte)z & 0x1f);
        if ((uVar199 & 1) != uVar177) {
          uVar199 = uVar199 & 0xf;
          iVar175 = 4;
          goto LAB_00120c17;
        }
LAB_00120c3a:
        uVar176 = uVar176 + 1;
      }
      else {
        if (uVar177 == 0) goto LAB_00120c3a;
        iVar175 = 0x81 - uVar176;
        if ((int)uVar176 < 0x7e) {
          iVar175 = 4;
        }
        uVar199 = 0;
LAB_00120c17:
        uVar191 = uVar199 + uVar177 >> 3 & 1;
        psVar187 = (secp256k1_context *)(ulong)uVar191;
        *(uint *)((long)(r->ecmult_gen_ctx).initial.x.n + (long)(int)uVar176 * 4 + -8) =
             uVar199 + uVar177 + uVar191 * -0x10;
        uVar176 = iVar175 + uVar176;
      }
      z = (secp256k1_context *)(ulong)uVar176;
    } while ((int)uVar176 < 0x81);
    r_00 = z;
    if ((int)psVar187 == 0) {
      if (uVar176 < 0x100) {
        do {
          uVar176 = (uint)r_00;
          if ((uVar176 < 0x20) && ((uVar180 >> (uVar176 & 0x1f) & 1) != 0)) {
            psStack_590 = (secp256k1_context *)0x120c72;
            secp256k1_ecmult_wnaf_cold_2();
            psVar185 = r;
            psVar194 = psVar184;
            goto LAB_00120c72;
          }
          r_00 = (secp256k1_context *)(ulong)(uVar176 + 1);
        } while (uVar176 + 1 != 0x100);
      }
      return;
    }
  }
  psStack_590 = (secp256k1_context *)secp256k1_ecmult_table_get_ge_storage;
  secp256k1_ecmult_wnaf_cold_1();
  psStack_598 = r;
  psStack_590 = psVar184;
  if ((extraout_RDX_05 & 1) == 0) {
    psStack_5a8 = (secp256k1_context *)0x120d40;
    secp256k1_ecmult_table_get_ge_storage_cold_4();
    psVar194 = r_00;
LAB_00120d40:
    psStack_5a8 = (secp256k1_context *)0x120d45;
    secp256k1_ecmult_table_get_ge_storage_cold_3();
LAB_00120d45:
    psStack_5a8 = (secp256k1_context *)0x120d4a;
    secp256k1_ecmult_table_get_ge_storage_cold_2();
  }
  else {
    uVar180 = (uint)extraout_RDX_05;
    psVar194 = r_00;
    if ((int)uVar180 < -7) goto LAB_00120d40;
    if (7 < (int)uVar180) goto LAB_00120d45;
    if (0 < (int)uVar180) {
      secp256k1_ge_from_storage
                ((secp256k1_ge *)r_00,
                 (secp256k1_ge_storage *)
                 ((long)&(a_04->ecmult_gen_ctx).initial.x + (ulong)(uVar180 - 1 >> 1) * 0x40 + -8));
      return;
    }
    a_04 = (secp256k1_context *)
           ((long)&(a_04->ecmult_gen_ctx).initial.x + (ulong)(~uVar180 >> 1) * 0x40 + -8);
    psStack_5a8 = (secp256k1_context *)0x120cd4;
    secp256k1_ge_from_storage((secp256k1_ge *)r_00,(secp256k1_ge_storage *)a_04);
    psVar184 = (secp256k1_context *)&(r_00->ecmult_gen_ctx).initial.x.magnitude;
    psStack_5a8 = (secp256k1_context *)0x120ce0;
    psVar194 = psVar184;
    secp256k1_fe_verify((secp256k1_fe *)psVar184);
    r = r_00;
    if ((int)(r_00->ecmult_gen_ctx).initial.y.n[4] < 2) {
      uVar183 = (r_00->ecmult_gen_ctx).initial.y.n[0];
      uVar173 = (r_00->ecmult_gen_ctx).initial.y.n[1];
      uVar174 = (r_00->ecmult_gen_ctx).initial.y.n[2];
      *(long *)&(r_00->ecmult_gen_ctx).initial.x.magnitude =
           0x3ffffbfffff0bc - *(long *)&(r_00->ecmult_gen_ctx).initial.x.magnitude;
      (r_00->ecmult_gen_ctx).initial.y.n[0] = 0x3ffffffffffffc - uVar183;
      (r_00->ecmult_gen_ctx).initial.y.n[1] = 0x3ffffffffffffc - uVar173;
      (r_00->ecmult_gen_ctx).initial.y.n[2] = 0x3ffffffffffffc - uVar174;
      (r_00->ecmult_gen_ctx).initial.y.n[3] =
           0x3fffffffffffc - (r_00->ecmult_gen_ctx).initial.y.n[3];
      (r_00->ecmult_gen_ctx).initial.y.n[4] = 2;
      secp256k1_fe_verify((secp256k1_fe *)psVar184);
      return;
    }
  }
  psStack_5a8 = (secp256k1_context *)secp256k1_gej_add_zinv_var;
  secp256k1_ecmult_table_get_ge_storage_cold_1();
  psStack_5d0 = r;
  psStack_5c8 = (secp256k1_gej *)cmp;
  psStack_5c0 = (secp256k1_context *)stride;
  psStack_5b8 = psVar184;
  psStack_5b0 = psVar206;
  psStack_5a8 = psVar187;
  secp256k1_ge_verify(a_03);
  secp256k1_fe_verify((secp256k1_fe *)z);
  if ((a_04->ecmult_gen_ctx).initial.z.magnitude == 0) {
    if (a_03->infinity != 0) {
      memcpy(psVar194,a_04,0x98);
      return;
    }
    piVar204 = &(a_04->ecmult_gen_ctx).initial.y.magnitude;
    psVar187 = (secp256k1_context *)auStack_638;
    secp256k1_fe_mul((secp256k1_fe *)psVar187,(secp256k1_fe *)piVar204,(secp256k1_fe *)z);
    secp256k1_fe_verify((secp256k1_fe *)psVar187);
    if (8 < (int)auStack_638._40_4_) goto LAB_00122062;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = auStack_638._0_8_ * 2;
    auVar97._8_8_ = 0;
    auVar97._0_8_ = auStack_638._24_8_;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = auStack_638._8_8_ * 2;
    auVar98._8_8_ = 0;
    auVar98._0_8_ = auStack_638._16_8_;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = auStack_638._32_8_;
    auVar99._8_8_ = 0;
    auVar99._0_8_ = auStack_638._32_8_;
    uVar201 = SUB168(auVar23 * auVar99,0);
    auVar24._8_8_ = 0;
    auVar24._0_8_ = uVar201 & 0xfffffffffffff;
    auVar21 = auVar22 * auVar98 + auVar21 * auVar97 + auVar24 * ZEXT816(0x1000003d10);
    uVar189 = auVar21._0_8_;
    auStack_698._0_8_ = uVar189 & 0xfffffffffffff;
    auVar152._8_8_ = 0;
    auVar152._0_8_ = uVar189 >> 0x34 | auVar21._8_8_ << 0xc;
    uVar189 = auStack_638._32_8_ * 2;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = auStack_638._0_8_;
    auVar100._8_8_ = 0;
    auVar100._0_8_ = uVar189;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = auStack_638._8_8_ * 2;
    auVar101._8_8_ = 0;
    auVar101._0_8_ = auStack_638._24_8_;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = auStack_638._16_8_;
    auVar102._8_8_ = 0;
    auVar102._0_8_ = auStack_638._16_8_;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uVar201 >> 0x34 | SUB168(auVar23 * auVar99,8) << 0xc;
    auVar21 = auVar25 * auVar100 + auVar152 + auVar26 * auVar101 + auVar27 * auVar102 +
              auVar28 * ZEXT816(0x1000003d10);
    auStack_7f8._48_8_ = auVar21._0_8_;
    auVar153._8_8_ = 0;
    auVar153._0_8_ = (ulong)auStack_7f8._48_8_ >> 0x34 | auVar21._8_8_ << 0xc;
    sStack_6c8.n[0] = (auStack_7f8._48_8_ & 0xfffffffffffff) >> 0x30;
    auStack_7f8._48_8_ = auStack_7f8._48_8_ & 0xffffffffffff;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = auStack_638._0_8_;
    auVar103._8_8_ = 0;
    auVar103._0_8_ = auStack_638._0_8_;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = auStack_638._8_8_;
    auVar104._8_8_ = 0;
    auVar104._0_8_ = uVar189;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = auStack_638._16_8_ * 2;
    auVar105._8_8_ = 0;
    auVar105._0_8_ = auStack_638._24_8_;
    auVar21 = auVar30 * auVar104 + auVar153 + auVar31 * auVar105;
    uVar201 = auVar21._0_8_;
    auVar155._8_8_ = 0;
    auVar155._0_8_ = uVar201 >> 0x34 | auVar21._8_8_ << 0xc;
    auVar106._8_8_ = 0;
    auVar106._0_8_ = (uVar201 & 0xfffffffffffff) << 4 | sStack_6c8.n[0];
    auVar21 = auVar29 * auVar103 + ZEXT816(0x1000003d1) * auVar106;
    uVar201 = auVar21._0_8_;
    sStack_6f8.n[0] = uVar201 & 0xfffffffffffff;
    auVar154._8_8_ = 0;
    auVar154._0_8_ = uVar201 >> 0x34 | auVar21._8_8_ << 0xc;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = auStack_638._0_8_ * 2;
    auVar107._8_8_ = 0;
    auVar107._0_8_ = auStack_638._8_8_;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = auStack_638._16_8_;
    auVar108._8_8_ = 0;
    auVar108._0_8_ = uVar189;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = auStack_638._24_8_;
    auVar109._8_8_ = 0;
    auVar109._0_8_ = auStack_638._24_8_;
    auVar22 = auVar33 * auVar108 + auVar155 + auVar34 * auVar109;
    uVar201 = auVar22._0_8_;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uVar201 & 0xfffffffffffff;
    auVar21 = auVar32 * auVar107 + auVar154 + auVar35 * ZEXT816(0x1000003d10);
    uVar202 = auVar21._0_8_;
    auVar157._8_8_ = 0;
    auVar157._0_8_ = uVar201 >> 0x34 | auVar22._8_8_ << 0xc;
    sStack_6f8.n[1] = uVar202 & 0xfffffffffffff;
    auVar156._8_8_ = 0;
    auVar156._0_8_ = uVar202 >> 0x34 | auVar21._8_8_ << 0xc;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = auStack_638._0_8_ * 2;
    auVar110._8_8_ = 0;
    auVar110._0_8_ = auStack_638._16_8_;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = auStack_638._8_8_;
    auVar111._8_8_ = 0;
    auVar111._0_8_ = auStack_638._8_8_;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = auStack_638._24_8_;
    auVar112._8_8_ = 0;
    auVar112._0_8_ = uVar189;
    auVar157 = auVar38 * auVar112 + auVar157;
    uVar189 = auVar157._0_8_;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar189 & 0xfffffffffffff;
    auVar21 = auVar36 * auVar110 + auVar156 + auVar37 * auVar111 + auVar39 * ZEXT816(0x1000003d10);
    uVar201 = auVar21._0_8_;
    sStack_6f8.n[2] = uVar201 & 0xfffffffffffff;
    auVar158._8_8_ = 0;
    auVar158._0_8_ = (uVar201 >> 0x34 | auVar21._8_8_ << 0xc) + auStack_698._0_8_;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = uVar189 >> 0x34 | auVar157._8_8_ << 0xc;
    auVar158 = auVar40 * ZEXT816(0x1000003d10) + auVar158;
    uVar189 = auVar158._0_8_;
    sStack_6f8.n[3] = uVar189 & 0xfffffffffffff;
    sStack_6f8.n[4] = (uVar189 >> 0x34 | auVar158._8_8_ << 0xc) + auStack_7f8._48_8_;
    sStack_6f8.magnitude = 1;
    sStack_6f8.normalized = 0;
    secp256k1_fe_verify(&sStack_6f8);
    auStack_698._0_4_ = (a_04->ecmult_gen_ctx).built;
    auStack_698._4_4_ = (a_04->ecmult_gen_ctx).blind;
    auStack_698._8_8_ = (a_04->ecmult_gen_ctx).initial.x.n[0];
    auStack_698._16_8_ = (a_04->ecmult_gen_ctx).initial.x.n[1];
    auStack_698._24_8_ = (a_04->ecmult_gen_ctx).initial.x.n[2];
    auStack_698._32_8_ = (a_04->ecmult_gen_ctx).initial.x.n[3];
    auStack_698._40_8_ = (a_04->ecmult_gen_ctx).initial.x.n[4];
    secp256k1_fe_verify((secp256k1_fe *)auStack_698);
    uVar201 = ((ulong)auStack_698._32_8_ >> 0x30) * 0x1000003d1 + auStack_698._0_8_;
    uVar189 = (uVar201 >> 0x34) + auStack_698._8_8_;
    uVar202 = (auStack_698._16_8_ + (uVar189 >> 0x34) >> 0x34) + auStack_698._24_8_;
    pvVar179 = (void *)(uVar202 & 0xfffffffffffff);
    p_Var207 = (_func_void_char_ptr_void_ptr *)
               ((uVar202 >> 0x34) + (auStack_698._32_8_ & 0xffffffffffff));
    p_Var205 = (_func_void_char_ptr_void_ptr *)
               ((ulong)(auStack_698._16_8_ + (uVar189 >> 0x34)) & 0xfffffffffffff);
    uVar189 = uVar189 & 0xfffffffffffff;
    uVar201 = uVar201 & 0xfffffffffffff;
    auStack_698._40_4_ = 1;
    auStack_698._0_8_ = uVar201;
    auStack_698._8_8_ = uVar189;
    auStack_698._16_8_ = p_Var205;
    auStack_698._24_8_ = pvVar179;
    auStack_698._32_8_ = p_Var207;
    secp256k1_fe_verify((secp256k1_fe *)auStack_698);
    secp256k1_fe_mul((secp256k1_fe *)(auStack_7f8 + 0x30),&a_03->x,&sStack_6f8);
    sStack_6c8.n[0]._0_4_ = (a_04->ecmult_gen_ctx).initial.x.magnitude;
    sStack_6c8.n[0]._4_4_ = (a_04->ecmult_gen_ctx).initial.x.normalized;
    sStack_6c8.n[1] = (a_04->ecmult_gen_ctx).initial.y.n[0];
    sStack_6c8.n[2] = (a_04->ecmult_gen_ctx).initial.y.n[1];
    sStack_6c8.n[3] = (a_04->ecmult_gen_ctx).initial.y.n[2];
    sStack_6c8.n[4] = (a_04->ecmult_gen_ctx).initial.y.n[3];
    sStack_6c8._40_8_ = (a_04->ecmult_gen_ctx).initial.y.n[4];
    secp256k1_fe_verify(&sStack_6c8);
    uVar202 = sStack_6c8.n[0] + (sStack_6c8.n[4] >> 0x30) * 0x1000003d1;
    uVar193 = (uVar202 >> 0x34) + sStack_6c8.n[1];
    uVar198 = sStack_6c8.n[2] + (uVar193 >> 0x34);
    uVar182 = (uVar198 >> 0x34) + sStack_6c8.n[3];
    uVar188 = uVar182 & 0xfffffffffffff;
    uVar183 = (uVar182 >> 0x34) + (sStack_6c8.n[4] & 0xffffffffffff);
    uVar198 = uVar198 & 0xfffffffffffff;
    uVar193 = uVar193 & 0xfffffffffffff;
    uVar202 = uVar202 & 0xfffffffffffff;
    sStack_6c8.magnitude = 1;
    sStack_6c8.n[0] = uVar202;
    sStack_6c8.n[1] = uVar193;
    sStack_6c8.n[2] = uVar198;
    sStack_6c8.n[3] = uVar188;
    sStack_6c8.n[4] = uVar183;
    secp256k1_fe_verify(&sStack_6c8);
    secp256k1_fe_mul((secp256k1_fe *)auStack_798,&a_03->y,&sStack_6f8);
    secp256k1_fe_mul((secp256k1_fe *)auStack_798,(secp256k1_fe *)auStack_798,
                     (secp256k1_fe *)auStack_638);
    secp256k1_fe_verify((secp256k1_fe *)auStack_698);
    uVar201 = 0x3ffffbfffff0bc - uVar201;
    uVar189 = 0x3ffffffffffffc - uVar189;
    uVar182 = 0x3ffffffffffffc - (long)p_Var205;
    uVar178 = 0x3ffffffffffffc - (long)pvVar179;
    uVar208 = 0x3fffffffffffc - (long)p_Var207;
    auStack_728._40_8_ = 2;
    auStack_728._0_8_ = uVar201;
    auStack_728._8_8_ = uVar189;
    auStack_728._16_8_ = uVar182;
    auStack_728._24_8_ = uVar178;
    auStack_728._32_8_ = uVar208;
    secp256k1_fe_verify((secp256k1_fe *)auStack_728);
    secp256k1_fe_verify((secp256k1_fe *)auStack_728);
    psVar187 = (secp256k1_context *)(auStack_7f8 + 0x30);
    secp256k1_fe_verify((secp256k1_fe *)psVar187);
    if (0x1e < iStack_7a0) goto LAB_00122067;
    uVar201 = uVar201 + auStack_7f8._48_8_;
    uVar189 = uVar189 + uStack_7c0;
    uVar182 = uVar182 + uStack_7b8;
    uVar178 = uVar178 + uStack_7b0;
    uVar208 = uVar208 + uStack_7a8;
    auStack_728._44_4_ = 0;
    auStack_728._40_4_ = iStack_7a0 + 2;
    auStack_728._0_8_ = uVar201;
    auStack_728._8_8_ = uVar189;
    auStack_728._16_8_ = uVar182;
    auStack_728._24_8_ = uVar178;
    auStack_728._32_8_ = uVar208;
    secp256k1_fe_verify((secp256k1_fe *)auStack_728);
    psVar187 = (secp256k1_context *)auStack_798;
    secp256k1_fe_verify((secp256k1_fe *)psVar187);
    if (1 < (int)auStack_798._40_4_) goto LAB_0012206c;
    sStack_668.magnitude = 2;
    sStack_668.normalized = 0;
    sStack_668.n[0] = 0x3ffffbfffff0bc - auStack_798._0_8_;
    sStack_668.n[1] = 0x3ffffffffffffc - auStack_798._8_8_;
    sStack_668.n[2] = 0x3ffffffffffffc - auStack_798._16_8_;
    sStack_668.n[3] = 0x3ffffffffffffc - auStack_798._24_8_;
    sStack_668.n[4] = 0x3fffffffffffc - auStack_798._32_8_;
    secp256k1_fe_verify(&sStack_668);
    secp256k1_fe_verify(&sStack_668);
    secp256k1_fe_verify(&sStack_6c8);
    uVar202 = uVar202 + (0x3ffffbfffff0bc - auStack_798._0_8_);
    uVar193 = (0x3ffffffffffffc - auStack_798._8_8_) + uVar193;
    uVar198 = uVar198 + (0x3ffffffffffffc - auStack_798._16_8_);
    uVar188 = (0x3ffffffffffffc - auStack_798._24_8_) + uVar188;
    uVar190 = (0x3fffffffffffc - auStack_798._32_8_) + uVar183;
    sStack_668.magnitude = 3;
    sStack_668.normalized = 0;
    sStack_668.n[0] = uVar202;
    sStack_668.n[1] = uVar193;
    sStack_668.n[2] = uVar198;
    sStack_668.n[3] = uVar188;
    sStack_668.n[4] = uVar190;
    secp256k1_fe_verify(&sStack_668);
    secp256k1_fe_verify((secp256k1_fe *)auStack_728);
    uVar201 = uVar201 + (uVar208 >> 0x30) * 0x1000003d1;
    if (((uVar201 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar201 & 0xfffffffffffff) == 0)) {
      uVar189 = uVar189 + (uVar201 >> 0x34);
      uVar182 = uVar182 + (uVar189 >> 0x34);
      uVar178 = (uVar182 >> 0x34) + uVar178;
      uVar208 = (uVar178 >> 0x34) + (uVar208 & 0xffffffffffff);
      if ((((uVar189 | uVar201 | uVar182 | uVar178) & 0xfffffffffffff) == 0 && uVar208 == 0) ||
         ((uVar201 + 0x1000003d0 & uVar189 & uVar182 & uVar178 & (uVar208 ^ 0xf000000000000)) ==
          0xfffffffffffff)) {
        secp256k1_fe_verify(&sStack_668);
        uVar202 = uVar202 + (uVar190 >> 0x30) * 0x1000003d1;
        if (((uVar202 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar202 & 0xfffffffffffff) == 0))
        {
          uVar193 = uVar193 + (uVar202 >> 0x34);
          uVar198 = uVar198 + (uVar193 >> 0x34);
          uVar188 = (uVar198 >> 0x34) + uVar188;
          uVar189 = (uVar188 >> 0x34) + (uVar190 & 0xffffffffffff);
          if ((((uVar193 | uVar202 | uVar198 | uVar188) & 0xfffffffffffff) == 0 && uVar189 == 0) ||
             ((uVar202 + 0x1000003d0 & uVar193 & uVar198 & uVar188 & (uVar189 ^ 0xf000000000000)) ==
              0xfffffffffffff)) {
            secp256k1_gej_double_var
                      ((secp256k1_gej *)psVar194,(secp256k1_gej *)a_04,(secp256k1_fe *)0x0);
            return;
          }
        }
        secp256k1_gej_set_infinity((secp256k1_gej *)psVar194);
        return;
      }
    }
    (psVar194->ecmult_gen_ctx).initial.z.magnitude = 0;
    psVar187 = (secp256k1_context *)auStack_728;
    secp256k1_fe_mul((secp256k1_fe *)&(psVar194->ecmult_gen_ctx).initial.y.magnitude,
                     (secp256k1_fe *)piVar204,(secp256k1_fe *)psVar187);
    secp256k1_fe_verify((secp256k1_fe *)psVar187);
    if (8 < (int)auStack_728._40_4_) goto LAB_00122071;
    psVar187 = (secp256k1_context *)(auStack_638 + 0x30);
    auVar41._8_8_ = 0;
    auVar41._0_8_ = auStack_728._0_8_ * 2;
    auVar113._8_8_ = 0;
    auVar113._0_8_ = auStack_728._24_8_;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = auStack_728._8_8_ * 2;
    auVar114._8_8_ = 0;
    auVar114._0_8_ = auStack_728._16_8_;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = auStack_728._32_8_;
    auVar115._8_8_ = 0;
    auVar115._0_8_ = auStack_728._32_8_;
    uVar201 = SUB168(auVar43 * auVar115,0);
    auVar44._8_8_ = 0;
    auVar44._0_8_ = uVar201 & 0xfffffffffffff;
    auVar21 = auVar42 * auVar114 + auVar41 * auVar113 + auVar44 * ZEXT816(0x1000003d10);
    uVar189 = auVar21._0_8_;
    auStack_7f8._0_8_ = uVar189 & 0xfffffffffffff;
    auVar159._8_8_ = 0;
    auVar159._0_8_ = uVar189 >> 0x34 | auVar21._8_8_ << 0xc;
    uVar189 = auStack_728._32_8_ * 2;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = auStack_728._0_8_;
    auVar116._8_8_ = 0;
    auVar116._0_8_ = uVar189;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = auStack_728._8_8_ * 2;
    auVar117._8_8_ = 0;
    auVar117._0_8_ = auStack_728._24_8_;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = auStack_728._16_8_;
    auVar118._8_8_ = 0;
    auVar118._0_8_ = auStack_728._16_8_;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = uVar201 >> 0x34 | SUB168(auVar43 * auVar115,8) << 0xc;
    auVar21 = auVar45 * auVar116 + auVar159 + auVar46 * auVar117 + auVar47 * auVar118 +
              auVar48 * ZEXT816(0x1000003d10);
    uVar201 = auVar21._0_8_;
    auVar160._8_8_ = 0;
    auVar160._0_8_ = uVar201 >> 0x34 | auVar21._8_8_ << 0xc;
    auStack_798._48_8_ = uVar201 & 0xffffffffffff;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = auStack_728._0_8_;
    auVar119._8_8_ = 0;
    auVar119._0_8_ = auStack_728._0_8_;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = auStack_728._8_8_;
    auVar120._8_8_ = 0;
    auVar120._0_8_ = uVar189;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = auStack_728._16_8_ * 2;
    auVar121._8_8_ = 0;
    auVar121._0_8_ = auStack_728._24_8_;
    auVar21 = auVar50 * auVar120 + auVar160 + auVar51 * auVar121;
    uVar202 = auVar21._0_8_;
    auVar162._8_8_ = 0;
    auVar162._0_8_ = uVar202 >> 0x34 | auVar21._8_8_ << 0xc;
    auVar122._8_8_ = 0;
    auVar122._0_8_ = (uVar202 & 0xfffffffffffff) << 4 | (uVar201 & 0xfffffffffffff) >> 0x30;
    auVar21 = auVar49 * auVar119 + ZEXT816(0x1000003d1) * auVar122;
    uVar201 = auVar21._0_8_;
    auStack_638._48_8_ = uVar201 & 0xfffffffffffff;
    auVar161._8_8_ = 0;
    auVar161._0_8_ = uVar201 >> 0x34 | auVar21._8_8_ << 0xc;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = auStack_728._0_8_ * 2;
    auVar123._8_8_ = 0;
    auVar123._0_8_ = auStack_728._8_8_;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = auStack_728._16_8_;
    auVar124._8_8_ = 0;
    auVar124._0_8_ = uVar189;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = auStack_728._24_8_;
    auVar125._8_8_ = 0;
    auVar125._0_8_ = auStack_728._24_8_;
    auVar22 = auVar53 * auVar124 + auVar162 + auVar54 * auVar125;
    uVar201 = auVar22._0_8_;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = uVar201 & 0xfffffffffffff;
    auVar21 = auVar52 * auVar123 + auVar161 + auVar55 * ZEXT816(0x1000003d10);
    uVar202 = auVar21._0_8_;
    auVar164._8_8_ = 0;
    auVar164._0_8_ = uVar201 >> 0x34 | auVar22._8_8_ << 0xc;
    uStack_600 = uVar202 & 0xfffffffffffff;
    auVar163._8_8_ = 0;
    auVar163._0_8_ = uVar202 >> 0x34 | auVar21._8_8_ << 0xc;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = auStack_728._0_8_ * 2;
    auVar126._8_8_ = 0;
    auVar126._0_8_ = auStack_728._16_8_;
    auVar57._8_8_ = 0;
    auVar57._0_8_ = auStack_728._8_8_;
    auVar127._8_8_ = 0;
    auVar127._0_8_ = auStack_728._8_8_;
    auVar58._8_8_ = 0;
    auVar58._0_8_ = auStack_728._24_8_;
    auVar128._8_8_ = 0;
    auVar128._0_8_ = uVar189;
    auVar164 = auVar58 * auVar128 + auVar164;
    uVar189 = auVar164._0_8_;
    auVar59._8_8_ = 0;
    auVar59._0_8_ = uVar189 & 0xfffffffffffff;
    auVar21 = auVar56 * auVar126 + auVar163 + auVar57 * auVar127 + auVar59 * ZEXT816(0x1000003d10);
    uVar201 = auVar21._0_8_;
    uStack_5f8 = uVar201 & 0xfffffffffffff;
    auVar165._8_8_ = 0;
    auVar165._0_8_ = (uVar201 >> 0x34 | auVar21._8_8_ << 0xc) + auStack_7f8._0_8_;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = uVar189 >> 0x34 | auVar164._8_8_ << 0xc;
    auVar165 = auVar60 * ZEXT816(0x1000003d10) + auVar165;
    uVar189 = auVar165._0_8_;
    uStack_5f0 = uVar189 & 0xfffffffffffff;
    uStack_5e8 = (uVar189 >> 0x34 | auVar165._8_8_ << 0xc) + auStack_798._48_8_;
    uStack_5e0 = 1;
    secp256k1_fe_verify((secp256k1_fe *)psVar187);
    secp256k1_fe_verify((secp256k1_fe *)psVar187);
    if (1 < (int)uStack_5e0) goto LAB_00122076;
    psVar195 = (secp256k1_fe *)(auStack_638 + 0x30);
    auStack_638._48_8_ = 0x3ffffbfffff0bc - auStack_638._48_8_;
    uStack_600 = 0x3ffffffffffffc - uStack_600;
    uStack_5f8 = 0x3ffffffffffffc - uStack_5f8;
    uStack_5f0 = 0x3ffffffffffffc - uStack_5f0;
    uStack_5e8 = 0x3fffffffffffc - uStack_5e8;
    uStack_5e0 = 2;
    secp256k1_fe_verify(psVar195);
    psVar187 = (secp256k1_context *)auStack_7f8;
    secp256k1_fe_mul((secp256k1_fe *)psVar187,psVar195,(secp256k1_fe *)auStack_728);
    secp256k1_fe_mul((secp256k1_fe *)(auStack_798 + 0x30),(secp256k1_fe *)auStack_698,psVar195);
    secp256k1_fe_verify(&sStack_668);
    auVar61._8_8_ = 0;
    auVar61._0_8_ = sStack_668.n[0] * 2;
    auVar129._8_8_ = 0;
    auVar129._0_8_ = sStack_668.n[3];
    auVar62._8_8_ = 0;
    auVar62._0_8_ = sStack_668.n[1] * 2;
    auVar130._8_8_ = 0;
    auVar130._0_8_ = sStack_668.n[2];
    auVar63._8_8_ = 0;
    auVar63._0_8_ = sStack_668.n[4];
    auVar131._8_8_ = 0;
    auVar131._0_8_ = sStack_668.n[4];
    uVar201 = SUB168(auVar63 * auVar131,0);
    auVar64._8_8_ = 0;
    auVar64._0_8_ = uVar201 & 0xfffffffffffff;
    auVar21 = auVar62 * auVar130 + auVar61 * auVar129 + auVar64 * ZEXT816(0x1000003d10);
    uVar202 = auVar21._0_8_;
    auVar166._8_8_ = 0;
    auVar166._0_8_ = uVar202 >> 0x34 | auVar21._8_8_ << 0xc;
    uVar189 = sStack_668.n[4] * 2;
    auVar65._8_8_ = 0;
    auVar65._0_8_ = sStack_668.n[0];
    auVar132._8_8_ = 0;
    auVar132._0_8_ = uVar189;
    auVar66._8_8_ = 0;
    auVar66._0_8_ = sStack_668.n[1] * 2;
    auVar133._8_8_ = 0;
    auVar133._0_8_ = sStack_668.n[3];
    auVar67._8_8_ = 0;
    auVar67._0_8_ = sStack_668.n[2];
    auVar134._8_8_ = 0;
    auVar134._0_8_ = sStack_668.n[2];
    auVar68._8_8_ = 0;
    auVar68._0_8_ = uVar201 >> 0x34 | SUB168(auVar63 * auVar131,8) << 0xc;
    auVar21 = auVar65 * auVar132 + auVar166 + auVar66 * auVar133 + auVar67 * auVar134 +
              auVar68 * ZEXT816(0x1000003d10);
    uStack_730 = auVar21._0_8_;
    auVar167._8_8_ = 0;
    auVar167._0_8_ = uStack_730 >> 0x34 | auVar21._8_8_ << 0xc;
    uStack_738 = (uStack_730 & 0xfffffffffffff) >> 0x30;
    uStack_730 = uStack_730 & 0xffffffffffff;
    auVar69._8_8_ = 0;
    auVar69._0_8_ = sStack_668.n[0];
    auVar135._8_8_ = 0;
    auVar135._0_8_ = sStack_668.n[0];
    auVar70._8_8_ = 0;
    auVar70._0_8_ = sStack_668.n[1];
    auVar136._8_8_ = 0;
    auVar136._0_8_ = uVar189;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = sStack_668.n[2] * 2;
    auVar137._8_8_ = 0;
    auVar137._0_8_ = sStack_668.n[3];
    auVar21 = auVar70 * auVar136 + auVar167 + auVar71 * auVar137;
    uVar201 = auVar21._0_8_;
    auVar169._8_8_ = 0;
    auVar169._0_8_ = uVar201 >> 0x34 | auVar21._8_8_ << 0xc;
    auVar138._8_8_ = 0;
    auVar138._0_8_ = (uVar201 & 0xfffffffffffff) << 4 | uStack_738;
    auVar21 = auVar69 * auVar135 + ZEXT816(0x1000003d1) * auVar138;
    uVar182 = auVar21._0_8_;
    uVar201 = uVar182 & 0xfffffffffffff;
    (psVar194->ecmult_gen_ctx).built = (int)uVar201;
    (psVar194->ecmult_gen_ctx).blind = (int)(uVar201 >> 0x20);
    auVar168._8_8_ = 0;
    auVar168._0_8_ = uVar182 >> 0x34 | auVar21._8_8_ << 0xc;
    auVar72._8_8_ = 0;
    auVar72._0_8_ = sStack_668.n[0] * 2;
    auVar139._8_8_ = 0;
    auVar139._0_8_ = sStack_668.n[1];
    auVar73._8_8_ = 0;
    auVar73._0_8_ = sStack_668.n[2];
    auVar140._8_8_ = 0;
    auVar140._0_8_ = uVar189;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = sStack_668.n[3];
    auVar141._8_8_ = 0;
    auVar141._0_8_ = sStack_668.n[3];
    auVar22 = auVar73 * auVar140 + auVar169 + auVar74 * auVar141;
    uVar201 = auVar22._0_8_;
    auVar75._8_8_ = 0;
    auVar75._0_8_ = uVar201 & 0xfffffffffffff;
    auVar21 = auVar72 * auVar139 + auVar168 + auVar75 * ZEXT816(0x1000003d10);
    uVar182 = auVar21._0_8_;
    auVar171._8_8_ = 0;
    auVar171._0_8_ = uVar201 >> 0x34 | auVar22._8_8_ << 0xc;
    (psVar194->ecmult_gen_ctx).initial.x.n[0] = uVar182 & 0xfffffffffffff;
    auVar170._8_8_ = 0;
    auVar170._0_8_ = uVar182 >> 0x34 | auVar21._8_8_ << 0xc;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = sStack_668.n[0] * 2;
    auVar142._8_8_ = 0;
    auVar142._0_8_ = sStack_668.n[2];
    auVar77._8_8_ = 0;
    auVar77._0_8_ = sStack_668.n[1];
    auVar143._8_8_ = 0;
    auVar143._0_8_ = sStack_668.n[1];
    auVar78._8_8_ = 0;
    auVar78._0_8_ = sStack_668.n[3];
    auVar144._8_8_ = 0;
    auVar144._0_8_ = uVar189;
    auVar171 = auVar78 * auVar144 + auVar171;
    uVar189 = auVar171._0_8_;
    auVar79._8_8_ = 0;
    auVar79._0_8_ = uVar189 & 0xfffffffffffff;
    auVar21 = auVar76 * auVar142 + auVar170 + auVar77 * auVar143 + auVar79 * ZEXT816(0x1000003d10);
    uVar201 = auVar21._0_8_;
    (psVar194->ecmult_gen_ctx).initial.x.n[1] = uVar201 & 0xfffffffffffff;
    auVar172._8_8_ = 0;
    auVar172._0_8_ = (uVar201 >> 0x34 | auVar21._8_8_ << 0xc) + (uVar202 & 0xfffffffffffff);
    auVar80._8_8_ = 0;
    auVar80._0_8_ = uVar189 >> 0x34 | auVar171._8_8_ << 0xc;
    auVar172 = auVar80 * ZEXT816(0x1000003d10) + auVar172;
    uVar189 = auVar172._0_8_;
    (psVar194->ecmult_gen_ctx).initial.x.n[2] = uVar189 & 0xfffffffffffff;
    (psVar194->ecmult_gen_ctx).initial.x.n[3] =
         (uVar189 >> 0x34 | auVar172._8_8_ << 0xc) + uStack_730;
    (psVar194->ecmult_gen_ctx).initial.x.n[4] = 1;
    secp256k1_fe_verify((secp256k1_fe *)psVar194);
    secp256k1_fe_verify((secp256k1_fe *)psVar194);
    secp256k1_fe_verify((secp256k1_fe *)psVar187);
    iVar175 = auStack_7f8._40_4_ + (int)(psVar194->ecmult_gen_ctx).initial.x.n[4];
    if (0x20 < iVar175) goto LAB_0012207b;
    uVar183 = (psVar194->ecmult_gen_ctx).initial.x.n[0];
    uVar173 = (psVar194->ecmult_gen_ctx).initial.x.n[1];
    uVar174 = (psVar194->ecmult_gen_ctx).initial.x.n[2];
    *(long *)&psVar194->ecmult_gen_ctx = *(long *)&psVar194->ecmult_gen_ctx + auStack_7f8._0_8_;
    (psVar194->ecmult_gen_ctx).initial.x.n[0] = uVar183 + auStack_7f8._8_8_;
    (psVar194->ecmult_gen_ctx).initial.x.n[1] = uVar173 + auStack_7f8._16_8_;
    (psVar194->ecmult_gen_ctx).initial.x.n[2] = uVar174 + auStack_7f8._24_8_;
    puVar197 = (psVar194->ecmult_gen_ctx).initial.x.n + 3;
    *puVar197 = *puVar197 + auStack_7f8._32_8_;
    *(int *)((psVar194->ecmult_gen_ctx).initial.x.n + 4) = iVar175;
    *(undefined4 *)((long)(psVar194->ecmult_gen_ctx).initial.x.n + 0x24) = 0;
    secp256k1_fe_verify((secp256k1_fe *)psVar194);
    secp256k1_fe_verify((secp256k1_fe *)psVar194);
    psVar187 = (secp256k1_context *)(auStack_798 + 0x30);
    secp256k1_fe_verify((secp256k1_fe *)psVar187);
    iVar175 = iStack_740 + (int)(psVar194->ecmult_gen_ctx).initial.x.n[4];
    if (0x20 < iVar175) goto LAB_00122080;
    uVar183 = (psVar194->ecmult_gen_ctx).initial.x.n[0];
    uVar173 = (psVar194->ecmult_gen_ctx).initial.x.n[1];
    uVar174 = (psVar194->ecmult_gen_ctx).initial.x.n[2];
    psVar187 = (secp256k1_context *)(auStack_798 + 0x30);
    *(long *)&psVar194->ecmult_gen_ctx = *(long *)&psVar194->ecmult_gen_ctx + auStack_798._48_8_;
    (psVar194->ecmult_gen_ctx).initial.x.n[0] = uVar183 + uStack_760;
    (psVar194->ecmult_gen_ctx).initial.x.n[1] = (uint64_t)(p_Stack_758 + uVar173);
    (psVar194->ecmult_gen_ctx).initial.x.n[2] = uVar174 + (long)pvStack_750;
    puVar197 = (psVar194->ecmult_gen_ctx).initial.x.n + 3;
    *puVar197 = (uint64_t)(p_Stack_748 + *puVar197);
    *(int *)((psVar194->ecmult_gen_ctx).initial.x.n + 4) = iVar175;
    *(undefined4 *)((long)(psVar194->ecmult_gen_ctx).initial.x.n + 0x24) = 0;
    secp256k1_fe_verify((secp256k1_fe *)psVar194);
    secp256k1_fe_verify((secp256k1_fe *)psVar194);
    secp256k1_fe_verify((secp256k1_fe *)psVar187);
    iVar175 = iStack_740 + (int)(psVar194->ecmult_gen_ctx).initial.x.n[4];
    if (0x20 < iVar175) goto LAB_00122085;
    uVar183 = (psVar194->ecmult_gen_ctx).initial.x.n[0];
    uVar173 = (psVar194->ecmult_gen_ctx).initial.x.n[1];
    uVar174 = (psVar194->ecmult_gen_ctx).initial.x.n[2];
    *(long *)&psVar194->ecmult_gen_ctx = *(long *)&psVar194->ecmult_gen_ctx + auStack_798._48_8_;
    (psVar194->ecmult_gen_ctx).initial.x.n[0] = uVar183 + uStack_760;
    (psVar194->ecmult_gen_ctx).initial.x.n[1] = (uint64_t)(p_Stack_758 + uVar173);
    (psVar194->ecmult_gen_ctx).initial.x.n[2] = uVar174 + (long)pvStack_750;
    puVar197 = (psVar194->ecmult_gen_ctx).initial.x.n + 3;
    *puVar197 = (uint64_t)(p_Stack_748 + *puVar197);
    *(int *)((psVar194->ecmult_gen_ctx).initial.x.n + 4) = iVar175;
    *(undefined4 *)((long)(psVar194->ecmult_gen_ctx).initial.x.n + 0x24) = 0;
    secp256k1_fe_verify((secp256k1_fe *)psVar194);
    secp256k1_fe_verify((secp256k1_fe *)(auStack_798 + 0x30));
    psVar187 = psVar194;
    secp256k1_fe_verify((secp256k1_fe *)psVar194);
    iVar175 = (int)(psVar194->ecmult_gen_ctx).initial.x.n[4] + iStack_740;
    if (iVar175 < 0x21) {
      auStack_798._48_8_ = *(long *)&psVar194->ecmult_gen_ctx + auStack_798._48_8_;
      uStack_760 = (psVar194->ecmult_gen_ctx).initial.x.n[0] + uStack_760;
      p_Stack_758 = p_Stack_758 + (psVar194->ecmult_gen_ctx).initial.x.n[1];
      pvStack_750 = (void *)((psVar194->ecmult_gen_ctx).initial.x.n[2] + (long)pvStack_750);
      p_Stack_748 = p_Stack_748 + (psVar194->ecmult_gen_ctx).initial.x.n[3];
      uStack_73c = 0;
      iStack_740 = iVar175;
      secp256k1_fe_verify((secp256k1_fe *)(auStack_798 + 0x30));
      piVar204 = &(psVar194->ecmult_gen_ctx).initial.x.magnitude;
      secp256k1_fe_mul((secp256k1_fe *)piVar204,(secp256k1_fe *)(auStack_798 + 0x30),&sStack_668);
      psVar187 = (secp256k1_context *)auStack_7f8;
      secp256k1_fe_mul((secp256k1_fe *)psVar187,(secp256k1_fe *)psVar187,&sStack_6c8);
      secp256k1_fe_verify((secp256k1_fe *)piVar204);
      secp256k1_fe_verify((secp256k1_fe *)psVar187);
      iVar175 = auStack_7f8._40_4_ + (int)(psVar194->ecmult_gen_ctx).initial.y.n[4];
      if (iVar175 < 0x21) {
        uVar183 = (psVar194->ecmult_gen_ctx).initial.y.n[0];
        uVar173 = (psVar194->ecmult_gen_ctx).initial.y.n[1];
        uVar174 = (psVar194->ecmult_gen_ctx).initial.y.n[2];
        *(long *)&(psVar194->ecmult_gen_ctx).initial.x.magnitude =
             *(long *)&(psVar194->ecmult_gen_ctx).initial.x.magnitude + auStack_7f8._0_8_;
        (psVar194->ecmult_gen_ctx).initial.y.n[0] = uVar183 + auStack_7f8._8_8_;
        (psVar194->ecmult_gen_ctx).initial.y.n[1] = uVar173 + auStack_7f8._16_8_;
        (psVar194->ecmult_gen_ctx).initial.y.n[2] = uVar174 + auStack_7f8._24_8_;
        puVar197 = (psVar194->ecmult_gen_ctx).initial.y.n + 3;
        *puVar197 = *puVar197 + auStack_7f8._32_8_;
        *(int *)((psVar194->ecmult_gen_ctx).initial.y.n + 4) = iVar175;
        *(undefined4 *)((long)(psVar194->ecmult_gen_ctx).initial.y.n + 0x24) = 0;
        secp256k1_fe_verify((secp256k1_fe *)piVar204);
        secp256k1_gej_verify((secp256k1_gej *)psVar194);
        return;
      }
      goto LAB_0012208f;
    }
  }
  else {
    (psVar194->ecmult_gen_ctx).initial.z.magnitude = a_03->infinity;
    psVar187 = z;
    secp256k1_fe_verify((secp256k1_fe *)z);
    if ((int)(z->ecmult_gen_ctx).initial.x.n[4] < 9) {
      uVar189 = *(ulong *)&z->ecmult_gen_ctx;
      uVar201 = (z->ecmult_gen_ctx).initial.x.n[0];
      uVar202 = (z->ecmult_gen_ctx).initial.x.n[1];
      uVar182 = (z->ecmult_gen_ctx).initial.x.n[2];
      uVar198 = (z->ecmult_gen_ctx).initial.x.n[3];
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar189 * 2;
      auVar81._8_8_ = 0;
      auVar81._0_8_ = uVar182;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar201 * 2;
      auVar82._8_8_ = 0;
      auVar82._0_8_ = uVar202;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar198;
      auVar83._8_8_ = 0;
      auVar83._0_8_ = uVar198;
      uVar178 = SUB168(auVar3 * auVar83,0);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar178 & 0xfffffffffffff;
      auVar21 = auVar2 * auVar82 + auVar1 * auVar81 + auVar4 * ZEXT816(0x1000003d10);
      uVar188 = auVar21._0_8_;
      sStack_6f8.n[0] = uVar188 & 0xfffffffffffff;
      auVar145._8_8_ = 0;
      auVar145._0_8_ = uVar188 >> 0x34 | auVar21._8_8_ << 0xc;
      uVar198 = uVar198 * 2;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar189;
      auVar84._8_8_ = 0;
      auVar84._0_8_ = uVar198;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar201 * 2;
      auVar85._8_8_ = 0;
      auVar85._0_8_ = uVar182;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar202;
      auVar86._8_8_ = 0;
      auVar86._0_8_ = uVar202;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar178 >> 0x34 | SUB168(auVar3 * auVar83,8) << 0xc;
      auVar21 = auVar5 * auVar84 + auVar145 + auVar6 * auVar85 + auVar7 * auVar86 +
                auVar8 * ZEXT816(0x1000003d10);
      uVar178 = auVar21._0_8_;
      auVar146._8_8_ = 0;
      auVar146._0_8_ = uVar178 >> 0x34 | auVar21._8_8_ << 0xc;
      auStack_7f8._48_8_ = (uVar178 & 0xfffffffffffff) >> 0x30;
      auStack_698._0_8_ = uVar178 & 0xffffffffffff;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = uVar189;
      auVar87._8_8_ = 0;
      auVar87._0_8_ = uVar189;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = uVar201;
      auVar88._8_8_ = 0;
      auVar88._0_8_ = uVar198;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = uVar202 * 2;
      auVar89._8_8_ = 0;
      auVar89._0_8_ = uVar182;
      auVar21 = auVar10 * auVar88 + auVar146 + auVar11 * auVar89;
      uVar178 = auVar21._0_8_;
      auVar148._8_8_ = 0;
      auVar148._0_8_ = uVar178 >> 0x34 | auVar21._8_8_ << 0xc;
      auVar90._8_8_ = 0;
      auVar90._0_8_ = (uVar178 & 0xfffffffffffff) << 4 | auStack_7f8._48_8_;
      auVar21 = auVar9 * auVar87 + ZEXT816(0x1000003d1) * auVar90;
      uVar178 = auVar21._0_8_;
      auStack_638._0_8_ = uVar178 & 0xfffffffffffff;
      auVar147._8_8_ = 0;
      auVar147._0_8_ = uVar178 >> 0x34 | auVar21._8_8_ << 0xc;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = uVar189 * 2;
      auVar91._8_8_ = 0;
      auVar91._0_8_ = uVar201;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = uVar202;
      auVar92._8_8_ = 0;
      auVar92._0_8_ = uVar198;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = uVar182;
      auVar93._8_8_ = 0;
      auVar93._0_8_ = uVar182;
      auVar22 = auVar13 * auVar92 + auVar148 + auVar14 * auVar93;
      uVar178 = auVar22._0_8_;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = uVar178 & 0xfffffffffffff;
      auVar21 = auVar12 * auVar91 + auVar147 + auVar15 * ZEXT816(0x1000003d10);
      uVar188 = auVar21._0_8_;
      auVar150._8_8_ = 0;
      auVar150._0_8_ = uVar178 >> 0x34 | auVar22._8_8_ << 0xc;
      auStack_638._8_8_ = uVar188 & 0xfffffffffffff;
      auVar149._8_8_ = 0;
      auVar149._0_8_ = uVar188 >> 0x34 | auVar21._8_8_ << 0xc;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = uVar189 * 2;
      auVar94._8_8_ = 0;
      auVar94._0_8_ = uVar202;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = uVar201;
      auVar95._8_8_ = 0;
      auVar95._0_8_ = uVar201;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = uVar182;
      auVar96._8_8_ = 0;
      auVar96._0_8_ = uVar198;
      auVar150 = auVar18 * auVar96 + auVar150;
      uVar189 = auVar150._0_8_;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = uVar189 & 0xfffffffffffff;
      auVar21 = auVar16 * auVar94 + auVar149 + auVar17 * auVar95 + auVar19 * ZEXT816(0x1000003d10);
      uVar201 = auVar21._0_8_;
      auStack_638._16_8_ = uVar201 & 0xfffffffffffff;
      auVar151._8_8_ = 0;
      auVar151._0_8_ =
           (_func_void_char_ptr_void_ptr *)
           (sStack_6f8.n[0] + (uVar201 >> 0x34 | auVar21._8_8_ << 0xc));
      auVar20._8_8_ = 0;
      auVar20._0_8_ = uVar189 >> 0x34 | auVar150._8_8_ << 0xc;
      auVar151 = auVar20 * ZEXT816(0x1000003d10) + auVar151;
      uVar189 = auVar151._0_8_;
      auStack_638._24_8_ = uVar189 & 0xfffffffffffff;
      auStack_638._32_8_ = (uVar189 >> 0x34 | auVar151._8_8_ << 0xc) + auStack_698._0_8_;
      auStack_638._40_8_ = 1;
      secp256k1_fe_verify((secp256k1_fe *)auStack_638);
      secp256k1_fe_mul(&sStack_6f8,(secp256k1_fe *)auStack_638,(secp256k1_fe *)z);
      secp256k1_fe_mul((secp256k1_fe *)psVar194,&a_03->x,(secp256k1_fe *)auStack_638);
      secp256k1_fe_mul((secp256k1_fe *)&(psVar194->ecmult_gen_ctx).initial.x.magnitude,&a_03->y,
                       &sStack_6f8);
      (psVar194->ecmult_gen_ctx).initial.y.magnitude = 1;
      (psVar194->ecmult_gen_ctx).initial.y.normalized = 0;
      (psVar194->ecmult_gen_ctx).initial.z.n[0] = 0;
      (psVar194->ecmult_gen_ctx).initial.z.n[1] = 0;
      psVar200 = &(psVar194->ecmult_gen_ctx).initial;
      (psVar200->z).n[2] = 0;
      (psVar200->z).n[3] = 0;
      (psVar194->ecmult_gen_ctx).initial.z.n[4] = 0x100000001;
      secp256k1_fe_verify((secp256k1_fe *)&(psVar194->ecmult_gen_ctx).initial.y.magnitude);
      return;
    }
    secp256k1_gej_add_zinv_var_cold_1();
LAB_00122062:
    secp256k1_gej_add_zinv_var_cold_11();
LAB_00122067:
    secp256k1_gej_add_zinv_var_cold_10();
LAB_0012206c:
    secp256k1_gej_add_zinv_var_cold_9();
LAB_00122071:
    secp256k1_gej_add_zinv_var_cold_8();
LAB_00122076:
    secp256k1_gej_add_zinv_var_cold_7();
LAB_0012207b:
    secp256k1_gej_add_zinv_var_cold_6();
LAB_00122080:
    secp256k1_gej_add_zinv_var_cold_5();
LAB_00122085:
    secp256k1_gej_add_zinv_var_cold_4();
  }
  secp256k1_gej_add_zinv_var_cold_3();
LAB_0012208f:
  secp256k1_gej_add_zinv_var_cold_2();
  (psVar187->ecmult_gen_ctx).initial.y.magnitude = 1;
  (psVar187->ecmult_gen_ctx).initial.x.n[4] = 0x100000000;
  (psVar187->ecmult_gen_ctx).built = 0;
  (psVar187->ecmult_gen_ctx).blind = 0;
  (psVar187->ecmult_gen_ctx).initial.x.n[0] = 0;
  (psVar187->ecmult_gen_ctx).initial.x.n[1] = 0;
  (psVar187->ecmult_gen_ctx).initial.x.n[2] = 0;
  (psVar187->ecmult_gen_ctx).initial.x.n[3] = 0;
  secp256k1_fe_verify((secp256k1_fe *)psVar187);
  (psVar187->ecmult_gen_ctx).initial.y.n[4] = 0x100000000;
  (psVar187->ecmult_gen_ctx).initial.x.magnitude = 0;
  (psVar187->ecmult_gen_ctx).initial.x.normalized = 0;
  (psVar187->ecmult_gen_ctx).initial.y.n[0] = 0;
  (psVar187->ecmult_gen_ctx).initial.y.n[1] = 0;
  (psVar187->ecmult_gen_ctx).initial.y.n[2] = 0;
  (psVar187->ecmult_gen_ctx).initial.y.n[3] = 0;
  secp256k1_fe_verify((secp256k1_fe *)&(psVar187->ecmult_gen_ctx).initial.x.magnitude);
  secp256k1_ge_verify((secp256k1_ge *)psVar187);
  return;
}

Assistant:

static SECP256K1_INLINE void heap_down(unsigned char *a, size_t i, size_t heap_size, size_t stride,
                            int (*cmp)(const void *, const void *, void *), void *cmp_data) {
    while (i < heap_size/2) {
        VERIFY_CHECK(i <= SIZE_MAX/2 - 1);
        /* Proof:
         * i < heap_size/2
         * i + 1 <= heap_size/2
         * 2*i + 2 <= heap_size <= SIZE_MAX
         * 2*i <= SIZE_MAX - 2
         */

        VERIFY_CHECK(child1(i) < heap_size);
        /* Proof:
         * i < heap_size/2
         * i + 1 <= heap_size/2
         * 2*i + 2 <= heap_size
         * 2*i + 1 < heap_size
         * child1(i) < heap_size
         */

        /* Let [x] be notation for the contents at a[x*stride].
         *
         * If [child1(i)] > [i] and [child2(i)] > [i],
         *   swap [i] with the larger child to ensure the new parent is larger
         *   than both children. When [child1(i)] == [child2(i)], swap [i] with
         *   [child2(i)].
         * Else if [child1(i)] > [i], swap [i] with [child1(i)].
         * Else if [child2(i)] > [i], swap [i] with [child2(i)].
         */
        if (child2(i) < heap_size
                && 0 <= cmp(a + child2(i)*stride, a + child1(i)*stride, cmp_data)) {
            if (0 < cmp(a + child2(i)*stride, a +         i*stride, cmp_data)) {
                heap_swap(a, i, child2(i), stride);
                i = child2(i);
            } else {
                /* At this point we have [child2(i)] >= [child1(i)] and we have
                 * [child2(i)] <= [i], and thus [child1(i)] <= [i] which means
                 * that the next comparison can be skipped. */
                return;
            }
        } else if (0 < cmp(a + child1(i)*stride, a +         i*stride, cmp_data)) {
            heap_swap(a, i, child1(i), stride);
            i = child1(i);
        } else {
            return;
        }
    }
    /* heap_size/2 <= i
     * heap_size/2 < i + 1
     * heap_size < 2*i + 2
     * heap_size <= 2*i + 1
     * heap_size <= child1(i)
     * Thus child1(i) and child2(i) are now out of bounds and we are at a leaf.
     */
}